

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logical.hpp
# Opt level: O3

void InstructionSet::x86::Primitive::
     or_<unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_char> destination,read_t<unsigned_char> source,Context *context)

{
  *destination = *destination | source;
  Flags::set_from<unsigned_int,(InstructionSet::x86::Flag)3,(InstructionSet::x86::Flag)0>
            (&context->flags,0);
  Flags::
  set_from<unsigned_char,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,*destination);
  return;
}

Assistant:

void or_(
	modify_t<IntT> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST OR SRC;
	*/
	/*
		The OF and CF flags are cleared; the SF, ZF, and PF flags are set according to the result.
		The state of the AF flag is undefined.
	*/
	destination |= source;

	context.flags.template set_from<Flag::Overflow, Flag::Carry>(0);
	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(destination);
}